

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInputPart.cpp
# Opt level: O0

bool anon_unknown.dwarf_1ab374::checkPixels<Imath_3_2::half>
               (Array2D<Imath_3_2::half> *ph,int lx,int rx,int ly,int ry,int width)

{
  ostream *poVar1;
  half *phVar2;
  void *pvVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  Array2D<Imath_3_2::half> *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar4;
  float fVar5;
  int x;
  int y;
  float in_stack_ffffffffffffffbc;
  half *in_stack_ffffffffffffffc0;
  int local_2c;
  int local_28;
  
  local_28 = in_ECX;
  do {
    local_2c = in_ESI;
    if (in_R8D < local_28) {
      return true;
    }
    for (; local_2c <= in_EDX; local_2c = local_2c + 1) {
      Imf_3_2::Array2D<Imath_3_2::half>::operator[](in_RDI,(long)local_28);
      fVar4 = Imath_3_2::half::operator_cast_to_float(in_stack_ffffffffffffffc0);
      Imath_3_2::half::half(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      fVar5 = Imath_3_2::half::operator_cast_to_float(in_stack_ffffffffffffffc0);
      if ((fVar4 != fVar5) || (NAN(fVar4) || NAN(fVar5))) {
        poVar1 = std::operator<<((ostream *)&std::cout,"value at ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_2c);
        poVar1 = std::operator<<(poVar1,", ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_28);
        poVar1 = std::operator<<(poVar1,": ");
        phVar2 = Imf_3_2::Array2D<Imath_3_2::half>::operator[](in_RDI,(long)local_28);
        poVar1 = (ostream *)::operator<<(poVar1,(half)phVar2[local_2c]._h);
        poVar1 = std::operator<<(poVar1,", should be ");
        pvVar3 = (void *)std::ostream::operator<<(poVar1,(local_28 * in_R9D + local_2c) % 0x801);
        pvVar3 = (void *)std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(pvVar3,std::flush<char,std::char_traits<char>>);
        return false;
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

bool
checkPixels (Array2D<T>& ph, int lx, int rx, int ly, int ry, int width)
{
    for (int y = ly; y <= ry; ++y)
        for (int x = lx; x <= rx; ++x)
            if (ph[y][x] != static_cast<T> (((y * width + x) % 2049)))
            {
                cout << "value at " << x << ", " << y << ": " << ph[y][x]
                     << ", should be " << (y * width + x) % 2049 << endl
                     << flush;
                return false;
            }
    return true;
}